

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_1_4_True(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  float *pfVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  float *pfVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  int scale;
  int iVar44;
  int iVar45;
  float *pfVar46;
  int k_count;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  undefined1 auVar80 [12];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  undefined1 auVar84 [64];
  int local_a8;
  
  auVar55._8_4_ = 0x3effffff;
  auVar55._0_8_ = 0x3effffff3effffff;
  auVar55._12_4_ = 0x3effffff;
  auVar54._8_4_ = 0x80000000;
  auVar54._0_8_ = 0x8000000080000000;
  auVar54._12_4_ = 0x80000000;
  fVar61 = ipoint->scale;
  auVar84 = ZEXT464((uint)fVar61);
  auVar47 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)fVar61),auVar54,0xf8);
  auVar47 = ZEXT416((uint)(fVar61 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  fVar60 = -0.08 / (fVar61 * fVar61);
  scale = (int)auVar47._0_4_;
  auVar48._0_4_ = (int)auVar47._0_4_;
  auVar48._4_4_ = (int)auVar47._4_4_;
  auVar48._8_4_ = (int)auVar47._8_4_;
  auVar48._12_4_ = (int)auVar47._12_4_;
  auVar47 = vcvtdq2ps_avx(auVar48);
  auVar48 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)ipoint->x),auVar54,0xf8);
  auVar48 = ZEXT416((uint)(ipoint->x + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49._0_8_ = (double)auVar48._0_4_;
  auVar49._8_8_ = auVar48._8_8_;
  auVar53._0_8_ = (double)fVar61;
  auVar53._8_8_ = 0;
  auVar48 = vfmadd231sd_fma(auVar49,auVar53,ZEXT816(0x3fe0000000000000));
  auVar52._0_4_ = (float)auVar48._0_8_;
  auVar52._4_12_ = auVar48._4_12_;
  auVar48 = vpternlogd_avx512vl(auVar55,ZEXT416((uint)ipoint->y),auVar54,0xf8);
  fVar5 = auVar52._0_4_ - auVar47._0_4_;
  auVar48 = ZEXT416((uint)(ipoint->y + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar50._0_8_ = (double)auVar48._0_4_;
  auVar50._8_8_ = auVar48._8_8_;
  auVar48 = vfmadd231sd_fma(auVar50,auVar53,ZEXT816(0x3fe0000000000000));
  auVar51._0_4_ = (float)auVar48._0_8_;
  auVar51._4_12_ = auVar48._4_12_;
  fVar83 = auVar51._0_4_ - auVar47._0_4_;
  auVar47 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar61),auVar52);
  auVar48 = vpternlogd_avx512vl(auVar55,auVar47,auVar54,0xf8);
  auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar48._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = ZEXT416((uint)fVar61);
  if (scale < (int)auVar47._0_4_) {
    auVar56._8_4_ = 0x3effffff;
    auVar56._0_8_ = 0x3effffff3effffff;
    auVar56._12_4_ = 0x3effffff;
    auVar57._8_4_ = 0x80000000;
    auVar57._0_8_ = 0x8000000080000000;
    auVar57._12_4_ = 0x80000000;
    auVar47 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar48,auVar51);
    auVar49 = vpternlogd_avx512vl(auVar57,auVar47,auVar56,0xea);
    auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar49._0_4_));
    auVar47 = vroundss_avx(auVar47,auVar47,0xb);
    if (scale < (int)auVar47._0_4_) {
      auVar47 = vfmadd231ss_fma(auVar52,auVar48,ZEXT416(0x41300000));
      auVar58._8_4_ = 0x80000000;
      auVar58._0_8_ = 0x8000000080000000;
      auVar58._12_4_ = 0x80000000;
      auVar49 = vpternlogd_avx512vl(auVar58,auVar47,auVar56,0xea);
      auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar49._0_4_));
      auVar47 = vroundss_avx(auVar47,auVar47,0xb);
      if ((int)auVar47._0_4_ + scale <= iimage->width) {
        auVar47 = vfmadd231ss_fma(auVar51,auVar48,ZEXT416(0x41300000));
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar49 = vpternlogd_avx512vl(auVar56,auVar47,auVar14,0xf8);
        auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar49._0_4_));
        auVar47 = vroundss_avx(auVar47,auVar47,0xb);
        if ((int)auVar47._0_4_ + scale <= iimage->height) {
          iVar2 = iimage->data_width;
          pfVar35 = iimage->data;
          iVar17 = scale * 2;
          lVar20 = 0;
          fVar5 = fVar5 + 0.5;
          iVar33 = -0xc;
          pfVar23 = haarResponseY + 3;
          pfVar46 = haarResponseX + 3;
          do {
            auVar47._0_4_ = (float)iVar33;
            auVar80 = in_ZMM10._4_12_;
            auVar47._4_12_ = auVar80;
            lVar29 = 0;
            auVar47 = vfmadd213ss_fma(auVar47,auVar48,ZEXT416((uint)(fVar83 + 0.5)));
            iVar16 = (int)auVar47._0_4_;
            iVar18 = (iVar16 + -1) * iVar2;
            iVar24 = (iVar16 + -1 + scale) * iVar2;
            iVar16 = (iVar16 + -1 + iVar17) * iVar2;
            do {
              iVar31 = (int)lVar29;
              auVar72._0_4_ = (float)(iVar31 + -0xc);
              auVar72._4_12_ = auVar80;
              auVar78._0_4_ = (float)(iVar31 + -0xb);
              auVar78._4_12_ = auVar80;
              auVar75._0_4_ = (float)(iVar31 + -10);
              auVar75._4_12_ = auVar80;
              auVar47 = vfmadd213ss_fma(auVar72,auVar48,ZEXT416((uint)fVar5));
              auVar49 = vfmadd213ss_fma(auVar78,auVar48,ZEXT416((uint)fVar5));
              auVar50 = vfmadd213ss_fma(auVar75,auVar48,ZEXT416((uint)fVar5));
              iVar40 = (int)auVar47._0_4_;
              auVar73._0_4_ = (float)(iVar31 + -9);
              auVar73._4_12_ = auVar80;
              auVar47 = vfmadd213ss_fma(auVar73,auVar48,ZEXT416((uint)fVar5));
              iVar32 = iVar40 + -1 + scale;
              iVar25 = iVar40 + -1 + iVar17;
              fVar61 = pfVar35[iVar16 + -1 + iVar40];
              iVar42 = (int)auVar49._0_4_;
              fVar65 = pfVar35[iVar18 + iVar25];
              iVar38 = iVar42 + -1 + scale;
              iVar41 = iVar42 + -1 + iVar17;
              auVar52 = SUB6416(ZEXT464(0x40000000),0);
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar18 + iVar32] -
                                                      pfVar35[iVar32 + iVar16])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar25 + iVar16] -
                                                      pfVar35[iVar18 + -1 + iVar40])));
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar24 + -1 + iVar40] -
                                                      pfVar35[iVar24 + iVar25])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar25 + iVar16] -
                                                      pfVar35[iVar18 + -1 + iVar40])));
              pfVar46[lVar29 + -3] = (fVar61 - fVar65) + auVar49._0_4_;
              pfVar23[lVar29 + -3] = auVar51._0_4_ - (fVar61 - fVar65);
              fVar61 = pfVar35[iVar16 + -1 + iVar42];
              iVar40 = (int)auVar50._0_4_;
              fVar65 = pfVar35[iVar18 + iVar41];
              iVar32 = iVar40 + -1 + scale;
              iVar25 = iVar40 + -1 + iVar17;
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar18 + iVar38] -
                                                      pfVar35[iVar38 + iVar16])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar41 + iVar16] -
                                                      pfVar35[iVar18 + -1 + iVar42])));
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar24 + -1 + iVar42] -
                                                      pfVar35[iVar24 + iVar41])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar41 + iVar16] -
                                                      pfVar35[iVar18 + -1 + iVar42])));
              pfVar46[lVar29 + -2] = (fVar61 - fVar65) + auVar49._0_4_;
              pfVar23[lVar29 + -2] = auVar50._0_4_ - (fVar61 - fVar65);
              iVar42 = (int)auVar47._0_4_;
              fVar61 = pfVar35[iVar16 + -1 + iVar40];
              fVar65 = pfVar35[iVar18 + iVar25];
              iVar38 = iVar42 + -1 + scale;
              iVar41 = iVar42 + -1 + iVar17;
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar18 + iVar32] -
                                                      pfVar35[iVar32 + iVar16])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar25 + iVar16] -
                                                      pfVar35[iVar18 + -1 + iVar40])));
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar24 + -1 + iVar40] -
                                                      pfVar35[iVar24 + iVar25])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar25 + iVar16] -
                                                      pfVar35[iVar18 + -1 + iVar40])));
              pfVar46[lVar29 + -1] = (fVar61 - fVar65) + auVar47._0_4_;
              pfVar23[lVar29 + -1] = auVar49._0_4_ - (fVar61 - fVar65);
              fVar61 = pfVar35[iVar16 + -1 + iVar42];
              fVar65 = pfVar35[iVar18 + iVar41];
              auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar18 + iVar38] -
                                                      pfVar35[iVar38 + iVar16])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar41 + iVar16] -
                                                      pfVar35[iVar18 + -1 + iVar42])));
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar35[iVar24 + -1 + iVar42] -
                                                      pfVar35[iVar24 + iVar41])),auVar52,
                                        ZEXT416((uint)(pfVar35[iVar41 + iVar16] -
                                                      pfVar35[iVar18 + -1 + iVar42])));
              pfVar46[lVar29] = (fVar61 - fVar65) + auVar47._0_4_;
              pfVar23[lVar29] = auVar49._0_4_ - (fVar61 - fVar65);
              lVar29 = lVar29 + 4;
            } while (iVar31 + -0xc < 8);
            pfVar23 = pfVar23 + 0x18;
            pfVar46 = pfVar46 + 0x18;
            iVar33 = iVar33 + 1;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x18);
          goto LAB_0019a51e;
        }
      }
    }
  }
  iVar2 = scale * 2;
  lVar29 = 0;
  lVar20 = 0;
  iVar17 = -0xc;
  do {
    auVar62._0_4_ = (float)iVar17;
    auVar62._4_12_ = in_ZMM8._4_12_;
    auVar47 = vfmadd213ss_fma(auVar62,auVar84._0_16_,ZEXT416((uint)fVar83));
    fVar61 = auVar47._0_4_;
    iVar41 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
    iVar18 = iVar2 + iVar41;
    iVar16 = iVar2 + -1 + iVar41;
    iVar24 = iVar41 + -1;
    iVar31 = iVar41 + -1 + scale;
    pfVar35 = haarResponseX;
    pfVar46 = haarResponseY;
    lVar28 = lVar29;
    iVar33 = -0xc;
    do {
      auVar63._0_4_ = (float)iVar33;
      auVar80 = in_ZMM8._4_12_;
      auVar63._4_12_ = auVar80;
      auVar50 = auVar84._0_16_;
      auVar47 = vfmadd213ss_fma(auVar63,auVar50,ZEXT416((uint)fVar5));
      auVar77._0_4_ = (float)(iVar33 + 1);
      auVar77._4_12_ = auVar80;
      auVar70._0_4_ = (float)(iVar33 + 2);
      auVar70._4_12_ = auVar80;
      auVar67._0_4_ = (float)(iVar33 + 3);
      auVar67._4_12_ = auVar80;
      auVar49 = vfmadd213ss_fma(auVar77,auVar50,ZEXT416((uint)fVar5));
      fVar76 = auVar49._0_4_;
      auVar49 = vfmadd213ss_fma(auVar70,auVar50,ZEXT416((uint)fVar5));
      auVar50 = vfmadd213ss_fma(auVar67,auVar50,ZEXT416((uint)fVar5));
      fVar61 = auVar47._0_4_;
      fVar65 = auVar50._0_4_;
      fVar69 = auVar49._0_4_;
      iVar25 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
      if (((iVar41 < 1) || (iVar25 < 1)) || (iimage->height < iVar18)) {
LAB_00199fed:
        haarXY(iimage,iVar41,iVar25,scale,(float *)((long)pfVar35 + lVar28),
               (float *)((long)pfVar46 + lVar28));
        iVar42 = iimage->width;
        pfVar35 = haarResponseX;
        pfVar46 = haarResponseY;
      }
      else {
        iVar42 = iimage->width;
        iVar32 = iVar2 + iVar25;
        if (iVar42 < iVar32) goto LAB_00199fed;
        iVar45 = iVar25 + -1 + scale;
        iVar38 = iimage->data_width;
        pfVar23 = iimage->data;
        iVar40 = iVar38 * iVar24;
        iVar44 = iVar38 * iVar16;
        fVar61 = pfVar23[iVar44 + -1 + iVar25];
        fVar6 = pfVar23[iVar40 + -1 + iVar32];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar23[iVar40 + iVar45] - pfVar23[iVar44 + iVar45]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar23[iVar44 + -1 + iVar32] -
                                                pfVar23[iVar40 + -1 + iVar25])));
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar23[iVar38 * iVar31 + -1 + iVar25] -
                                                pfVar23[iVar38 * iVar31 + -1 + iVar32])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar23[iVar44 + -1 + iVar32] -
                                                pfVar23[iVar40 + -1 + iVar25])));
        *(float *)((long)pfVar35 + lVar28) = (fVar61 - fVar6) + auVar47._0_4_;
        *(float *)((long)pfVar46 + lVar28) = auVar49._0_4_ - (fVar61 - fVar6);
      }
      pfVar23 = (float *)((long)pfVar35 + lVar28 + 4);
      pfVar1 = (float *)((long)pfVar46 + lVar28 + 4);
      iVar25 = (int)((double)((ulong)(0.0 <= fVar76) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar76) * -0x4020000000000000) + (double)fVar76);
      if (((iVar41 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar18 || (iVar32 = iVar2 + iVar25, iVar42 < iVar32)))) {
        haarXY(iimage,iVar41,iVar25,scale,pfVar23,pfVar1);
        iVar42 = iimage->width;
        pfVar35 = haarResponseX;
        pfVar46 = haarResponseY;
      }
      else {
        iVar40 = iVar25 + -1 + scale;
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar45 = iVar38 * iVar24;
        iVar44 = iVar38 * iVar16;
        fVar61 = pfVar3[iVar44 + -1 + iVar25];
        fVar76 = pfVar3[iVar45 + -1 + iVar32];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar45 + iVar40] - pfVar3[iVar44 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar32] -
                                                pfVar3[iVar45 + -1 + iVar25])));
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar31 + -1 + iVar25] -
                                                pfVar3[iVar38 * iVar31 + -1 + iVar32])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar32] -
                                                pfVar3[iVar45 + -1 + iVar25])));
        *pfVar23 = (fVar61 - fVar76) + auVar47._0_4_;
        *pfVar1 = auVar49._0_4_ - (fVar61 - fVar76);
      }
      pfVar23 = (float *)((long)pfVar35 + lVar28 + 8);
      pfVar1 = (float *)((long)pfVar46 + lVar28 + 8);
      iVar25 = (int)((double)((ulong)(0.0 <= fVar69) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar69) * -0x4020000000000000) + (double)fVar69);
      if (((iVar41 < 1) || (iVar25 < 1)) ||
         ((iimage->height < iVar18 || (iVar32 = iVar2 + iVar25, iVar42 < iVar32)))) {
        haarXY(iimage,iVar41,iVar25,scale,pfVar23,pfVar1);
        iVar42 = iimage->width;
        pfVar35 = haarResponseX;
        pfVar46 = haarResponseY;
      }
      else {
        iVar40 = iVar25 + -1 + scale;
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar45 = iVar38 * iVar24;
        iVar44 = iVar38 * iVar16;
        fVar61 = pfVar3[iVar44 + -1 + iVar25];
        fVar69 = pfVar3[iVar45 + -1 + iVar32];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar45 + iVar40] - pfVar3[iVar44 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar32] -
                                                pfVar3[iVar45 + -1 + iVar25])));
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar31 + -1 + iVar25] -
                                                pfVar3[iVar38 * iVar31 + -1 + iVar32])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar32] -
                                                pfVar3[iVar45 + -1 + iVar25])));
        *pfVar23 = (fVar61 - fVar69) + auVar47._0_4_;
        *pfVar1 = auVar49._0_4_ - (fVar61 - fVar69);
      }
      pfVar23 = (float *)((long)pfVar35 + lVar28 + 0xc);
      pfVar1 = (float *)((long)pfVar46 + lVar28 + 0xc);
      iVar25 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
      if ((((iVar41 < 1) || (iVar25 < 1)) || (iimage->height < iVar18)) ||
         (iVar32 = iVar2 + iVar25, iVar42 < iVar32)) {
        haarXY(iimage,iVar41,iVar25,scale,pfVar23,pfVar1);
        pfVar35 = haarResponseX;
        pfVar46 = haarResponseY;
      }
      else {
        iVar42 = iimage->data_width;
        iVar38 = iVar25 + -1 + scale;
        pfVar3 = iimage->data;
        iVar45 = iVar42 * iVar24;
        iVar40 = iVar42 * iVar16;
        fVar61 = pfVar3[iVar40 + -1 + iVar25];
        fVar65 = pfVar3[iVar45 + -1 + iVar32];
        auVar47 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar45 + iVar38] - pfVar3[iVar40 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar40 + -1 + iVar32] -
                                                pfVar3[iVar45 + -1 + iVar25])));
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar42 * iVar31 + -1 + iVar25] -
                                                pfVar3[iVar42 * iVar31 + -1 + iVar32])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar40 + -1 + iVar32] -
                                                pfVar3[iVar45 + -1 + iVar25])));
        *pfVar23 = (fVar61 - fVar65) + auVar47._0_4_;
        *pfVar1 = auVar49._0_4_ - (fVar61 - fVar65);
      }
      auVar84 = ZEXT1664(auVar48);
      lVar28 = lVar28 + 0x10;
      bVar4 = iVar33 < 8;
      iVar33 = iVar33 + 4;
    } while (bVar4);
    iVar17 = iVar17 + 1;
    lVar20 = lVar20 + 1;
    lVar29 = lVar29 + 0x60;
  } while (lVar20 != 0x18);
LAB_0019a51e:
  fVar83 = auVar84._0_4_;
  auVar82._8_4_ = 0x3effffff;
  auVar82._0_8_ = 0x3effffff3effffff;
  auVar82._12_4_ = 0x3effffff;
  auVar81._8_4_ = 0x80000000;
  auVar81._0_8_ = 0x8000000080000000;
  auVar81._12_4_ = 0x80000000;
  auVar47 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)(fVar83 * 0.5)),auVar81,0xf8);
  auVar47 = ZEXT416((uint)(fVar83 * 0.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)(fVar83 * 1.5)),auVar81,0xf8);
  auVar48 = ZEXT416((uint)(fVar83 * 1.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)(fVar83 * 2.5)),auVar81,0xf8);
  auVar49 = ZEXT416((uint)(fVar83 * 2.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)(fVar83 * 3.5)),auVar81,0xf8);
  auVar50 = ZEXT416((uint)(fVar83 * 3.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)(fVar83 * 4.5)),auVar81,0xf8);
  auVar51 = ZEXT416((uint)(fVar83 * 4.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)(fVar83 * 5.5)),auVar81,0xf8);
  auVar52 = ZEXT416((uint)(fVar83 * 5.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)(fVar83 * 6.5)),auVar81,0xf8);
  auVar53 = ZEXT416((uint)(fVar83 * 6.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)(fVar83 * 7.5)),auVar81,0xf8);
  auVar54 = ZEXT416((uint)(auVar54._0_4_ + fVar83 * 7.5));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)(fVar83 * 8.5)),auVar81,0xf8);
  auVar55 = ZEXT416((uint)(fVar83 * 8.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)(fVar83 * 9.5)),auVar81,0xf8);
  auVar56 = ZEXT416((uint)(fVar83 * 9.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)(fVar83 * 10.5)),auVar81,0xf8);
  auVar57 = ZEXT416((uint)(fVar83 * 10.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar82,ZEXT416((uint)(fVar83 * 11.5)),auVar81,0xf8);
  fVar66 = auVar49._0_4_;
  fVar61 = fVar66 + auVar48._0_4_;
  fVar5 = fVar66 + auVar47._0_4_;
  auVar49 = ZEXT416((uint)(fVar83 * 11.5 + auVar58._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  fVar83 = fVar66 - auVar47._0_4_;
  fVar65 = fVar66 - auVar48._0_4_;
  fVar69 = fVar66 - auVar50._0_4_;
  fVar76 = fVar66 - auVar51._0_4_;
  fVar6 = fVar66 - auVar52._0_4_;
  fVar66 = fVar66 - auVar53._0_4_;
  fVar79 = auVar54._0_4_;
  fVar7 = fVar79 - auVar50._0_4_;
  fVar8 = fVar79 - auVar51._0_4_;
  fVar9 = fVar79 - auVar52._0_4_;
  fVar10 = fVar79 - auVar53._0_4_;
  fVar11 = fVar79 - auVar55._0_4_;
  fVar12 = fVar79 - auVar56._0_4_;
  fVar13 = fVar79 - auVar57._0_4_;
  fVar79 = fVar79 - auVar49._0_4_;
  gauss_s1_c0[0] = expf(fVar61 * fVar61 * fVar60);
  gauss_s1_c0[1] = expf(fVar5 * fVar5 * fVar60);
  gauss_s1_c0[2] = expf(fVar83 * fVar83 * fVar60);
  gauss_s1_c0[3] = expf(fVar65 * fVar65 * fVar60);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar69 * fVar69 * fVar60);
  gauss_s1_c0[6] = expf(fVar76 * fVar76 * fVar60);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar60);
  gauss_s1_c0[8] = expf(fVar66 * fVar66 * fVar60);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar60);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar60);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar60);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar60);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar60);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar60);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar60);
  gauss_s1_c1[8] = expf(fVar79 * fVar79 * fVar60);
  auVar64._8_4_ = 0x7fffffff;
  auVar64._0_8_ = 0x7fffffff7fffffff;
  auVar64._12_4_ = 0x7fffffff;
  uVar21 = 0xfffffff8;
  fVar61 = 0.0;
  lVar20 = 0;
  lVar29 = 0;
  local_a8 = 0;
  do {
    pfVar35 = gauss_s1_c1;
    uVar19 = (uint)uVar21;
    if (uVar19 != 7) {
      pfVar35 = gauss_s1_c0;
    }
    lVar28 = (long)local_a8;
    lVar29 = (long)(int)lVar29;
    if (uVar19 == 0xfffffff8) {
      pfVar35 = gauss_s1_c1;
    }
    uVar39 = 0;
    local_a8 = local_a8 + 4;
    uVar34 = 0xfffffff8;
    lVar36 = (long)haarResponseX + lVar20;
    lVar27 = (long)haarResponseY + lVar20;
    do {
      pfVar46 = gauss_s1_c1;
      if (uVar34 != 7) {
        pfVar46 = gauss_s1_c0;
      }
      auVar84 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar34 == 0xfffffff8) {
        pfVar46 = gauss_s1_c1;
      }
      uVar22 = (ulong)(uVar34 >> 0x1c & 0xfffffff8);
      uVar26 = uVar39;
      lVar30 = lVar27;
      lVar43 = lVar36;
      do {
        lVar37 = 0;
        pfVar23 = (float *)((long)pfVar35 + (ulong)(uint)((int)(uVar21 >> 0x1f) << 5));
        do {
          fVar5 = pfVar46[uVar22] * *pfVar23;
          pfVar23 = pfVar23 + (ulong)(~uVar19 >> 0x1f) * 2 + -1;
          auVar47 = vinsertps_avx(ZEXT416(*(uint *)(lVar30 + lVar37 * 4)),
                                  ZEXT416(*(uint *)(lVar43 + lVar37 * 4)),0x10);
          lVar37 = lVar37 + 1;
          auVar74._0_4_ = fVar5 * auVar47._0_4_;
          auVar74._4_4_ = fVar5 * auVar47._4_4_;
          auVar74._8_4_ = fVar5 * auVar47._8_4_;
          auVar74._12_4_ = fVar5 * auVar47._12_4_;
          auVar47 = vandps_avx(auVar74,auVar64);
          auVar47 = vmovlhps_avx(auVar74,auVar47);
          auVar68._0_4_ = auVar84._0_4_ + auVar47._0_4_;
          auVar68._4_4_ = auVar84._4_4_ + auVar47._4_4_;
          auVar68._8_4_ = auVar84._8_4_ + auVar47._8_4_;
          auVar68._12_4_ = auVar84._12_4_ + auVar47._12_4_;
          auVar84 = ZEXT1664(auVar68);
        } while (lVar37 != 9);
        uVar26 = uVar26 + 0x18;
        uVar22 = uVar22 + (ulong)(-1 < (int)uVar34) * 2 + -1;
        lVar43 = lVar43 + 0x60;
        lVar30 = lVar30 + 0x60;
      } while (uVar26 < uVar34 * 0x18 + 0x198);
      uVar34 = uVar34 + 5;
      uVar39 = uVar39 + 0x78;
      fVar5 = gauss_s2_arr[lVar28];
      auVar15._4_4_ = fVar5;
      auVar15._0_4_ = fVar5;
      auVar15._8_4_ = fVar5;
      auVar15._12_4_ = fVar5;
      auVar50 = vmulps_avx512vl(auVar68,auVar15);
      lVar28 = lVar28 + 1;
      auVar71._0_4_ = auVar50._0_4_ * auVar50._0_4_;
      auVar71._4_4_ = auVar50._4_4_ * auVar50._4_4_;
      auVar71._8_4_ = auVar50._8_4_ * auVar50._8_4_;
      auVar71._12_4_ = auVar50._12_4_ * auVar50._12_4_;
      auVar48 = vshufpd_avx(auVar50,auVar50,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar29) = auVar50;
      lVar29 = lVar29 + 4;
      lVar36 = lVar36 + 0x1e0;
      lVar27 = lVar27 + 0x1e0;
      auVar47 = vmovshdup_avx(auVar71);
      auVar49 = vfmadd231ss_fma(auVar47,auVar50,auVar50);
      auVar47 = vshufps_avx(auVar50,auVar50,0xff);
      auVar48 = vfmadd213ss_fma(auVar48,auVar48,auVar49);
      auVar47 = vfmadd213ss_fma(auVar47,auVar47,auVar48);
      fVar61 = fVar61 + auVar47._0_4_;
    } while (local_a8 != (int)lVar28);
    lVar20 = lVar20 + 0x14;
    uVar21 = (ulong)(uVar19 + 5);
  } while ((int)uVar19 < 3);
  if (fVar61 < 0.0) {
    fVar61 = sqrtf(fVar61);
  }
  else {
    auVar47 = vsqrtss_avx(ZEXT416((uint)fVar61),ZEXT416((uint)fVar61));
    fVar61 = auVar47._0_4_;
  }
  lVar20 = 0;
  auVar84 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar61)));
  do {
    auVar59 = vmulps_avx512f(auVar84,*(undefined1 (*) [64])(ipoint->descriptor + lVar20));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar20) = auVar59;
    lVar20 = lVar20 + 0x10;
  } while (lVar20 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_4_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}